

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O0

void VW::validate_min_max_label(vw *all)

{
  undefined8 uVar1;
  long *in_RDI;
  stringstream __msg;
  string *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  vw_exception *in_stack_fffffffffffffe60;
  stringstream local_190 [16];
  ostream local_180;
  
  if (*(float *)(*in_RDI + 0x6c) < *(float *)(*in_RDI + 0x68)) {
    std::__cxx11::stringstream::stringstream(local_190);
    std::operator<<(&local_180,"Max label cannot be less than min label.");
    uVar1 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    vw_exception::vw_exception
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
               in_stack_fffffffffffffe48);
    __cxa_throw(uVar1,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  return;
}

Assistant:

void validate_min_max_label(vw& all)
{
  if (all.sd->max_label < all.sd->min_label)
    THROW("Max label cannot be less than min label.");
}